

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_TakeStep_Z(void *arkode_mem,realtype *dsmPtr,int *nflagPtr)

{
  int iVar1;
  int iVar2;
  int *in_RDX;
  ARKodeMem in_RSI;
  N_Vector *Xvecs;
  realtype *cvals;
  N_Vector zcor0;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  int deduce_stage;
  int implicit_stage;
  int nvec;
  int is;
  int retval;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  char *in_stack_ffffffffffffffa0;
  N_Vector *X;
  void *in_stack_ffffffffffffffa8;
  N_Vector y;
  SUNNonlinearSolver in_stack_ffffffffffffffb0;
  ARKodeARKStepMem local_48;
  undefined4 local_40;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  uint uVar3;
  int local_4;
  
  iVar1 = arkStep_AccessStepMem
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     (ARKodeMem *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                     (ARKodeARKStepMem *)0xe8b2be);
  if (iVar1 != 0) {
    return iVar1;
  }
  y = (N_Vector)local_48->cvals;
  X = local_48->Xvecs;
  if ((local_48->implicit == 0) && (local_48->mass_type == 0)) {
    *in_RDX = 0;
  }
  iVar1 = 0;
  if ((local_48->NLS != (SUNNonlinearSolver)0x0) &&
     (local_48->NLS->ops->setup != (_func_int_SUNNonlinearSolver_N_Vector_void_ptr *)0x0)) {
    in_stack_ffffffffffffffb0 =
         *(SUNNonlinearSolver *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x130);
    N_VConst((realtype)X,(N_Vector)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    iVar1 = SUNNonlinSolSetup(in_stack_ffffffffffffffb0,y,X);
    if (iVar1 < 0) {
      return -0x1e;
    }
    if (0 < iVar1) {
      return -0x1f;
    }
  }
  uVar3 = 0;
  do {
    if (local_48->stages <= (int)uVar3) {
      if (local_48->mass_type == 1) {
        local_4 = arkStep_ComputeSolutions_MassFixed
                            ((ARKodeMem)CONCAT44(iVar1,uVar3),
                             (realtype *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      }
      else {
        local_4 = arkStep_ComputeSolutions
                            ((ARKodeMem)CONCAT44(iVar1,uVar3),
                             (realtype *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      }
      if (-1 < local_4) {
        if (local_4 < 1) {
          if (*(int *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x200) != 0) {
            fprintf(*(FILE **)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x208),
                    "ARKStep  etest  %li  %.16g  %.16g\n",
                    *(undefined8 *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x168),
                    (int)in_RSI->sunctx,
                    *(undefined8 *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x1d8));
          }
          local_4 = 0;
        }
        else {
          *in_RDX = local_4;
          local_4 = 5;
        }
      }
      return local_4;
    }
    local_48->istage = uVar3;
    if (local_48->implicit == 0) {
      *(double *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x198) =
           local_48->Be->c[(int)uVar3] *
           *(double *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x168) +
           *(double *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x230);
    }
    else {
      *(double *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x198) =
           local_48->Bi->c[(int)uVar3] *
           *(double *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x168) +
           *(double *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x230);
    }
    if ((local_48->mass_type == 2) && (local_48->msetup != (ARKMassSetupFn)0x0)) {
      iVar1 = (*local_48->msetup)((void *)CONCAT44(in_stack_ffffffffffffffc4,local_40),
                                  *(realtype *)
                                   (CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x198),
                                  *(N_Vector *)
                                   (CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x120),
                                  *(N_Vector *)
                                   (CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x128),
                                  *(N_Vector *)
                                   (CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x130));
      if (iVar1 != 0) {
        return -0xf;
      }
      iVar1 = 0;
    }
    in_stack_ffffffffffffffd0 = 0;
    if (local_48->implicit != 0) {
      in_stack_ffffffffffffffd0 = (uint)(1e-10 < ABS(local_48->Bi->A[(int)uVar3][(int)uVar3]));
    }
    if (in_stack_ffffffffffffffd0 != 0) {
      iVar1 = arkStep_Predict(in_RSI,(int)((ulong)in_RDX >> 0x20),(N_Vector)CONCAT44(iVar1,uVar3));
      if (iVar1 != 0) {
        return iVar1;
      }
      if (local_48->stage_predict != (ARKStagePredictFn)0x0) {
        iVar1 = (*local_48->stage_predict)
                          (*(realtype *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x198),
                           local_48->zpred,
                           *(void **)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x10));
        if (iVar1 < 0) {
          return -0x27;
        }
        if (0 < iVar1) {
          return 5;
        }
      }
    }
    iVar1 = arkStep_StageSetup((ARKodeMem)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                               in_stack_ffffffffffffffc4);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (*(int *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x200) != 0) {
      fprintf(*(FILE **)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x208),
              "ARKStep  step  %li  %.16g  %i  %.16g\n",
              *(undefined8 *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x168),
              (int)*(undefined8 *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x198),
              *(undefined8 *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x1d8),(ulong)uVar3);
    }
    if (in_stack_ffffffffffffffd0 == 0) {
      if (local_48->mass_type == 1) {
        iVar2 = (*local_48->msolve)((void *)CONCAT44(in_stack_ffffffffffffffc4,local_40),
                                    local_48->sdata,local_48->nlscoef);
        *in_RDX = iVar2;
        if (*in_RDX != 0) {
          return 5;
        }
      }
      N_VLinearSum((realtype)in_stack_ffffffffffffffb0,y,(realtype)X,
                   (N_Vector)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                   (N_Vector)0xe8b711);
    }
    else {
      iVar2 = arkStep_Nls((ARKodeMem)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc4);
      *in_RDX = iVar2;
      if (*in_RDX != 0) {
        return 5;
      }
    }
    if (*(long *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x298) != 0) {
      iVar1 = (**(code **)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x298))
                        (*(undefined8 *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x198),
                         *(undefined8 *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x108),
                         *(undefined8 *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x10));
      if (iVar1 != 0) {
        return -0x26;
      }
      iVar1 = 0;
    }
    if (local_48->implicit != 0) {
      in_stack_ffffffffffffff9f = local_48->deduce_rhs != 0 && in_stack_ffffffffffffffd0 != 0;
      in_stack_ffffffffffffffcc = (uint)(byte)in_stack_ffffffffffffff9f;
      if (in_stack_ffffffffffffffcc == 0) {
        iVar1 = (*local_48->fi)(*(realtype *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x198),
                                *(N_Vector *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x108),
                                local_48->Fi[(int)uVar3],
                                *(void **)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x10));
        local_48->nfi = local_48->nfi + 1;
      }
      else if (local_48->mass_type == 1) {
        iVar1 = (*local_48->mmult)((void *)CONCAT44(in_stack_ffffffffffffffc4,local_40),
                                   local_48->zcor,
                                   *(N_Vector *)
                                    (CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x120));
        if (iVar1 != 0) {
          return -0x12;
        }
        N_VLinearSum((realtype)in_stack_ffffffffffffffb0,y,(realtype)X,
                     (N_Vector)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                     (N_Vector)0xe8b8b1);
      }
      else {
        N_VLinearSum((realtype)in_stack_ffffffffffffffb0,y,(realtype)X,
                     (N_Vector)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                     (N_Vector)0xe8b906);
      }
      if (iVar1 < 0) {
        return -8;
      }
      if (0 < iVar1) {
        return -0xb;
      }
      if (local_48->impforcing != 0) {
        y->content = (void *)0x3ff0000000000000;
        *X = local_48->Fi[(int)uVar3];
        in_stack_ffffffffffffffd4 = 1;
        arkStep_ApplyForcing
                  (local_48,*(realtype *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x198),1.0,
                   (int *)&stack0xffffffffffffffd4);
        N_VLinearCombination
                  ((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(realtype *)y,X,
                   (N_Vector)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      }
    }
    if (local_48->explicit != 0) {
      iVar1 = (*local_48->fe)(local_48->Be->c[(int)uVar3] *
                              *(double *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x168) +
                              *(double *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x230),
                              *(N_Vector *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x108),
                              local_48->Fe[(int)uVar3],
                              *(void **)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x10));
      local_48->nfe = local_48->nfe + 1;
      if (iVar1 < 0) {
        return -8;
      }
      if (0 < iVar1) {
        return -0xb;
      }
      if (local_48->expforcing != 0) {
        y->content = (void *)0x3ff0000000000000;
        *X = local_48->Fe[(int)uVar3];
        in_stack_ffffffffffffffd4 = 1;
        arkStep_ApplyForcing
                  (local_48,local_48->Be->c[(int)uVar3] *
                            *(double *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x168) +
                            *(double *)(CONCAT44(in_stack_ffffffffffffffc4,local_40) + 0x230),1.0,
                   (int *)&stack0xffffffffffffffd4);
        N_VLinearCombination
                  ((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(realtype *)y,X,
                   (N_Vector)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      }
    }
    if (local_48->mass_type == 2) {
      if ((local_48->implicit != 0) && (in_stack_ffffffffffffffcc == 0)) {
        iVar2 = (*local_48->msolve)((void *)CONCAT44(in_stack_ffffffffffffffc4,local_40),
                                    local_48->Fi[(int)uVar3],local_48->nlscoef);
        *in_RDX = iVar2;
        if (*in_RDX != 0) {
          return 5;
        }
      }
      if (local_48->explicit != 0) {
        iVar2 = (*local_48->msolve)((void *)CONCAT44(in_stack_ffffffffffffffc4,local_40),
                                    local_48->Fe[(int)uVar3],local_48->nlscoef);
        *in_RDX = iVar2;
        if (*in_RDX != 0) {
          return 5;
        }
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

int arkStep_TakeStep_Z(void* arkode_mem, realtype *dsmPtr, int *nflagPtr)
{
  int retval, is, nvec;
  booleantype implicit_stage;
  booleantype deduce_stage;
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  N_Vector zcor0;
  realtype* cvals;
  N_Vector* Xvecs;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "arkStep_TakeStep_Z",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* local shortcuts for use with fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* if problem will involve no algebraic solvers, initialize nflagPtr to success */
  if ((!step_mem->implicit) && (step_mem->mass_type == MASS_IDENTITY))
    *nflagPtr = ARK_SUCCESS;

  /* call nonlinear solver setup if it exists */
  if (step_mem->NLS)
    if ((step_mem->NLS)->ops->setup) {
      zcor0 = ark_mem->tempv3;
      N_VConst(ZERO, zcor0);    /* set guess to all 0 (since using predictor-corrector form) */
      retval = SUNNonlinSolSetup(step_mem->NLS, zcor0, ark_mem);
      if (retval < 0) return(ARK_NLS_SETUP_FAIL);
      if (retval > 0) return(ARK_NLS_SETUP_RECVR);
    }

  /* loop over internal stages to the step */
  for (is=0; is<step_mem->stages; is++) {

    /* store current stage index */
    step_mem->istage = is;

    /* set current stage time(s) */
    if (step_mem->implicit)
      ark_mem->tcur = ark_mem->tn + step_mem->Bi->c[is]*ark_mem->h;
    else
      ark_mem->tcur = ark_mem->tn + step_mem->Be->c[is]*ark_mem->h;

#ifdef SUNDIALS_DEBUG
    printf("    ARKStep step %li,  stage %i,  h = %"RSYM",  t_n = %"RSYM"\n",
           ark_mem->nst, is, ark_mem->h, ark_mem->tcur);
#endif

    /* setup time-dependent mass matrix */
    if ((step_mem->mass_type == MASS_TIMEDEP) && (step_mem->msetup != NULL)) {
      retval = step_mem->msetup((void *) ark_mem, ark_mem->tcur,
                                ark_mem->tempv1, ark_mem->tempv2,
                                ark_mem->tempv3);
      if (retval != ARK_SUCCESS)  return(ARK_MASSSETUP_FAIL);
    }

    /* determine whether implicit solve is required */
    implicit_stage = SUNFALSE;
    if (step_mem->implicit)
      if (SUNRabs(step_mem->Bi->A[is][is]) > TINY)
        implicit_stage = SUNTRUE;

#ifdef SUNDIALS_DEBUG
    if (implicit_stage)
      printf("implicit stage\n");
    else
      printf("explicit stage\n");
#endif

    /* if implicit, call built-in and user-supplied predictors
       (results placed in zpred) */
    if (implicit_stage) {

      retval = arkStep_Predict(ark_mem, is, step_mem->zpred);
      if (retval != ARK_SUCCESS)  return (retval);

      /* if a user-supplied predictor routine is provided, call that here.
         Note that arkStep_Predict is *still* called, so this user-supplied
         routine can just 'clean up' the built-in prediction, if desired. */
      if (step_mem->stage_predict) {
        retval = step_mem->stage_predict(ark_mem->tcur, step_mem->zpred,
                                         ark_mem->user_data);
        if (retval < 0)  return(ARK_USER_PREDICT_FAIL);
        if (retval > 0)  return(TRY_AGAIN);
      }

    }

#ifdef SUNDIALS_DEBUG_PRINTVEC
    printf("    ARKStep predictor:\n");
    N_VPrint(step_mem->zpred);
#endif

    /* set up explicit data for evaluation of ARK stage (store in sdata) */
    retval = arkStep_StageSetup(ark_mem, implicit_stage);
    if (retval != ARK_SUCCESS)  return (retval);

#ifdef SUNDIALS_DEBUG_PRINTVEC
    printf("    ARKStep rhs data:\n");
    N_VPrint(step_mem->sdata);
#endif

    /* solver diagnostics reporting */
    if (ark_mem->report)
      fprintf(ark_mem->diagfp, "ARKStep  step  %li  %"RSYM"  %i  %"RSYM"\n",
              ark_mem->nst, ark_mem->h, is, ark_mem->tcur);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                       "ARKODE::arkStep_TakeStep_Z", "start-step",
                       "step = %li, h = "RSYM", stage = %i, tcur = %"RSYM,
                       ark_mem->nst, ark_mem->h, is, ark_mem->tcur);
#endif

    /* perform implicit solve if required */
    if (implicit_stage) {

      /* implicit solve result is stored in ark_mem->ycur;
         return with positive value on anything but success */
      *nflagPtr = arkStep_Nls(ark_mem, *nflagPtr);
      if (*nflagPtr != ARK_SUCCESS)  return(TRY_AGAIN);

#ifdef SUNDIALS_DEBUG_PRINTVEC
      printf("    ARKStep implicit stage %i solution:\n",is);
      N_VPrint(ark_mem->ycur);
#endif

    /* otherwise no implicit solve is needed */
    } else {

      /* if M is fixed, solve with it to compute update (place back in sdata) */
      if (step_mem->mass_type == MASS_FIXED) {

        /* perform solve; return with positive value on anything but success */
        *nflagPtr = step_mem->msolve((void *) ark_mem, step_mem->sdata,
                                     step_mem->nlscoef);
        if (*nflagPtr != ARK_SUCCESS)  return(TRY_AGAIN);

      }

      /* set y to be yn + sdata (either computed in arkStep_StageSetup,
         or updated in prev. block) */
      N_VLinearSum(ONE, ark_mem->yn, ONE, step_mem->sdata, ark_mem->ycur);

#ifdef SUNDIALS_DEBUG_PRINTVEC
      printf("    ARKStep explicit stage %i solution:\n",is);
      N_VPrint(ark_mem->ycur);
#endif

    }

    /* apply user-supplied stage postprocessing function (if supplied) */
    /* NOTE: with internally inconsistent IMEX methods (c_i^E != c_i^I) the value
       of tcur corresponds to the stage time from the implicit table (c_i^I). */
    if (ark_mem->ProcessStage != NULL) {
      retval = ark_mem->ProcessStage(ark_mem->tcur,
                                     ark_mem->ycur,
                                     ark_mem->user_data);
      if (retval != 0) return(ARK_POSTPROCESS_STAGE_FAIL);
    }

    /* successful stage solve */
    /*    store implicit RHS (value in Fi[is] is from preceding nonlinear iteration) */
    if (step_mem->implicit) {
      deduce_stage = step_mem->deduce_rhs && implicit_stage;

      if (!deduce_stage) {
        retval = step_mem->fi(ark_mem->tcur, ark_mem->ycur,
                              step_mem->Fi[is], ark_mem->user_data);
        step_mem->nfi++;
      } else if (step_mem->mass_type == MASS_FIXED)  {
        retval = step_mem->mmult((void *) ark_mem, step_mem->zcor, ark_mem->tempv1);
        if (retval != ARK_SUCCESS)  return (ARK_MASSMULT_FAIL);
        N_VLinearSum(ONE / step_mem->gamma, ark_mem->tempv1,
                     -ONE / step_mem->gamma, step_mem->sdata, step_mem->Fi[is]);
      } else {
        N_VLinearSum(ONE / step_mem->gamma, step_mem->zcor,
                     -ONE / step_mem->gamma, step_mem->sdata, step_mem->Fi[is]);
      }

#ifdef SUNDIALS_DEBUG_PRINTVEC
      printf("    ARKStep implicit stage RHS Fi[%i]:\n",is);
      N_VPrint(step_mem->Fi[is]);
#endif

      if (retval < 0)  return(ARK_RHSFUNC_FAIL);
      if (retval > 0)  return(ARK_UNREC_RHSFUNC_ERR);
      /* apply external polynomial forcing */
      if (step_mem->impforcing) {
        cvals[0] = ONE;
        Xvecs[0] = step_mem->Fi[is];
        nvec     = 1;
        arkStep_ApplyForcing(step_mem, ark_mem->tcur, ONE, &nvec);
        N_VLinearCombination(nvec, cvals, Xvecs, step_mem->Fi[is]);
      }
    }

    /*    store explicit RHS */
    if (step_mem->explicit) {
        retval = step_mem->fe(ark_mem->tn + step_mem->Be->c[is]*ark_mem->h,
                              ark_mem->ycur, step_mem->Fe[is], ark_mem->user_data);
        step_mem->nfe++;

#ifdef SUNDIALS_DEBUG_PRINTVEC
        printf("    ARKStep explicit stage RHS Fe[%i]:\n",is);
        N_VPrint(step_mem->Fe[is]);
#endif

        if (retval < 0)  return(ARK_RHSFUNC_FAIL);
        if (retval > 0)  return(ARK_UNREC_RHSFUNC_ERR);
        /* apply external polynomial forcing */
        if (step_mem->expforcing) {
          cvals[0] = ONE;
          Xvecs[0] = step_mem->Fe[is];
          nvec     = 1;
          arkStep_ApplyForcing(step_mem, ark_mem->tn+step_mem->Be->c[is]*ark_mem->h,
                               ONE, &nvec);
          N_VLinearCombination(nvec, cvals, Xvecs, step_mem->Fe[is]);
        }
    }

    /* if using a time-dependent mass matrix, update Fe[is] and/or Fi[is] with M(t)^{-1} */
    if (step_mem->mass_type == MASS_TIMEDEP) {
      /* If the implicit stage was deduced, it already includes M(t)^{-1} */
      if (step_mem->implicit && !deduce_stage) {
        *nflagPtr = step_mem->msolve((void *) ark_mem, step_mem->Fi[is], step_mem->nlscoef);
        if (*nflagPtr != ARK_SUCCESS)  return(TRY_AGAIN);
      }
      if (step_mem->explicit) {
        *nflagPtr = step_mem->msolve((void *) ark_mem, step_mem->Fe[is], step_mem->nlscoef);
        if (*nflagPtr != ARK_SUCCESS)  return(TRY_AGAIN);
      }
    }

  } /* loop over stages */

  /* compute time-evolved solution (in ark_ycur), error estimate (in dsm).
     This can fail recoverably due to nonconvergence of the mass matrix solve,
     so handle that appropriately. */
  if (step_mem->mass_type == MASS_FIXED) {
    retval = arkStep_ComputeSolutions_MassFixed(ark_mem, dsmPtr);
  } else {
    retval = arkStep_ComputeSolutions(ark_mem, dsmPtr);
  }
  if (retval < 0)  return(retval);
  if (retval > 0) {
    *nflagPtr = retval;
    return(TRY_AGAIN);
  }

#ifdef SUNDIALS_DEBUG_PRINTVEC
    printf("    ARKStep updated solution:\n");
    N_VPrint(ark_mem->ycur);
#endif

#ifdef SUNDIALS_DEBUG
  printf("    ARKStep error estimate = %"RSYM"\n", *dsmPtr);
#endif

  /* solver diagnostics reporting */
  if (ark_mem->report)
    fprintf(ark_mem->diagfp, "ARKStep  etest  %li  %"RSYM"  %"RSYM"\n",
            ark_mem->nst, ark_mem->h, *dsmPtr);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                     "ARKODE::arkStep_TakeStep_Z", "error-test",
                     "step = %li, h = "RSYM", dsm = %"RSYM,
                     ark_mem->nst, ark_mem->h, *dsmPtr);
#endif

  return(ARK_SUCCESS);
}